

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileConnections.hpp
# Opt level: O3

void helics::fileops::makeConnectionsJson<helics::CoreBroker>(CoreBroker *brk,string *file)

{
  value_t vVar1;
  pointer pcVar2;
  size_type sVar3;
  undefined1 uVar4;
  bool bVar5;
  const_iterator cVar6;
  helics *phVar7;
  const_reference pvVar8;
  iterator iVar9;
  const_iterator cVar10;
  reference pvVar11;
  string_type *psVar12;
  reference pbVar13;
  undefined8 uVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  undefined8 uVar16;
  _Any_data *p_Var17;
  _Any_data *in_R8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  string_view publication;
  string_view source;
  string_view filter;
  string_view valueName;
  string_view interfaceKey;
  string_view valueName_00;
  string_view interfaceKey_00;
  string_view input;
  anon_class_16_2_4418202b callback;
  anon_class_16_2_4418055b callback_00;
  anon_class_16_2_4418055b callback_01;
  anon_class_16_2_4417f657 callback_02;
  anon_class_16_2_4417f657 callback_03;
  string_view target;
  anon_class_16_2_4418202b callback_04;
  anon_class_16_2_4418055b callback_05;
  anon_class_16_2_4418055b callback_06;
  anon_class_16_2_4417f657 callback_07;
  anon_class_16_2_4417f657 callback_08;
  string_view endpoint;
  anon_class_16_2_d8a696df callback_09;
  anon_class_16_2_d8a696df callback_10;
  anon_class_16_2_d8a696df callback_11;
  anon_class_16_2_d8a696df callback_12;
  anon_class_16_2_d8a696df callback_13;
  string_view value;
  string_view alias;
  string_view value_00;
  string_view alias_00;
  string pub;
  string ipt;
  json doc;
  string ept;
  iterator __begin3;
  iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  __end4;
  undefined1 local_3b8 [32];
  CoreBroker *local_398;
  undefined1 local_390 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370;
  undefined1 local_360 [32];
  undefined1 local_340 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330;
  undefined1 local_320 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_310;
  _Alloc_hider local_300;
  undefined1 local_2b0 [24];
  __native_type local_298 [2];
  undefined1 local_240 [32];
  string local_220 [16];
  _Any_data local_210;
  _Elt_pointer local_200 [2];
  _Elt_pointer local_1f0 [2];
  _Elt_pointer local_1e0 [2];
  Time local_1d0;
  Time local_1c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1b0;
  Time local_1a0;
  time_point local_190;
  _Alloc_hider local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  string local_120 [16];
  undefined8 local_110 [2];
  _Any_data *local_100 [2];
  _Any_data local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  undefined1 local_d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  _Hash_node_base local_b0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  __node_base local_80;
  _Hash_node_base local_70 [2];
  _Any_data *local_60 [2];
  _Any_data local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_370._M_local_buf[0] = '\0';
  local_370._8_8_ = 0;
  local_398 = brk;
  loadJson((fileops *)local_40._M_local_buf,(string *)file);
  uVar14 = local_370._8_8_;
  uVar4 = local_370._M_local_buf[0];
  local_370._M_local_buf[0] = local_40._M_local_buf[0];
  local_40._M_local_buf[0] = uVar4;
  local_370._8_8_ = local_40._8_8_;
  local_40._8_8_ = uVar14;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data((data *)&local_40);
  if (local_370._M_local_buf[0] != '\x01') goto LAB_00300336;
  cVar6 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
          ::_M_find_tr<char[12],void>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                      *)local_370._8_8_,(char (*) [12])0x3e9ef4);
  if (cVar6._M_node != (_Base_ptr)(local_370._8_8_ + 8)) {
    local_320._0_8_ =
         nlohmann::json_abi_v3_11_3::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
         ::operator[]<char_const>
                   ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     *)local_370._M_local_buf,"connections");
    local_320._8_8_ = (_Rb_tree_node_base *)0x0;
    aStack_310._M_allocated_capacity = 0;
    aStack_310._8_8_ = (pointer)0x8000000000000000;
    vVar1 = (((reference)local_320._0_8_)->m_data).m_type;
    if (vVar1 == null) {
      aStack_310._8_8_ = (pointer)0x1;
LAB_002fed69:
      local_2b0._8_8_ = (__pthread_internal_list *)0x0;
      local_2b0._16_8_ = (__pthread_internal_list *)0x0;
      local_298[0].__align = 1;
    }
    else if (vVar1 == array) {
      aStack_310._M_allocated_capacity =
           (size_type)
           (((((reference)local_320._0_8_)->m_data).m_value.array)->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      local_2b0._8_8_ = (__pthread_internal_list *)0x0;
      local_298[0].__align = -0x8000000000000000;
      local_2b0._16_8_ =
           (((((reference)local_320._0_8_)->m_data).m_value.array)->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      if (vVar1 != object) {
        aStack_310._8_8_ = (pointer)0x0;
        goto LAB_002fed69;
      }
      local_320._8_8_ = ((((reference)local_320._0_8_)->m_data).m_value.binary)->m_subtype;
      local_2b0._16_8_ = (__pthread_internal_list *)0x0;
      local_298[0].__align = -0x8000000000000000;
      local_2b0._8_8_ =
           &(((((reference)local_320._0_8_)->m_data).m_value.object)->_M_t)._M_impl.
            super__Rb_tree_header;
    }
    local_2b0._0_8_ = local_320._0_8_;
    while( true ) {
      paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_360 + 0x10);
      bVar5 = nlohmann::json_abi_v3_11_3::detail::
              iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
              ::
              operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                        ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                          *)local_320,
                         (iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                          *)local_2b0);
      if (bVar5) break;
      phVar7 = (helics *)
               nlohmann::json_abi_v3_11_3::detail::
               iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
               ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                            *)local_320);
      if ((*phVar7 == (helics)0x2) &&
         (0x10 < (ulong)((*(long **)(phVar7 + 8))[1] - **(long **)(phVar7 + 8)))) {
        pvVar8 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)phVar7,0);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (local_3b8,pvVar8);
        uVar16 = local_3b8._8_8_;
        uVar14 = local_3b8._0_8_;
        pvVar8 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)phVar7,1);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((CoreBroker *)local_390,pvVar8);
        publication._M_str = (char *)uVar14;
        publication._M_len = uVar16;
        input._M_str = (char *)local_390._0_8_;
        input._M_len = local_390._8_8_;
        in_R8 = (_Any_data *)local_390._0_8_;
        CoreBroker::dataLink(local_398,publication,input);
        uVar14 = local_390._16_8_;
        p_Var17 = (_Any_data *)local_390._0_8_;
        if ((_Any_data *)local_390._0_8_ != (_Any_data *)(local_390 + 0x10)) {
LAB_002ff269:
          operator_delete(p_Var17,(ulong)((long)&(((pointer)uVar14)->name)._M_dataplus._M_p + 1));
        }
      }
      else {
        local_390._0_8_ = local_390 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"publication","");
        if ((*phVar7 == (helics)0x1) &&
           (iVar9 = CLI::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                    ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                             **)(phVar7 + 8),(key_type *)local_390),
           iVar9._M_node != (_Base_ptr)(*(long *)(phVar7 + 8) + 8))) {
          pvVar8 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                 *)phVar7,(key_type *)local_390);
          if ((pvVar8->m_data).m_type == string) {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (local_3b8,pvVar8);
          }
          else {
            generateJsonString((string *)local_3b8,pvVar8,true);
          }
        }
        else {
          local_3b8._0_8_ = local_3b8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,0,0);
        }
        if ((_Any_data *)local_390._0_8_ != (_Any_data *)(local_390 + 0x10)) {
          operator_delete((void *)local_390._0_8_,local_390._16_8_ + 1);
        }
        if ((_func_int **)local_3b8._8_8_ == (_func_int **)0x0) {
          local_360._0_8_ = paVar18;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"input","");
          if ((*phVar7 == (helics)0x1) &&
             (iVar9 = CLI::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                      ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                               **)(phVar7 + 8),(key_type *)local_360),
             iVar9._M_node != (_Base_ptr)(*(long *)(phVar7 + 8) + 8))) {
            pvVar8 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                   *)phVar7,(key_type *)local_360);
            if ((pvVar8->m_data).m_type == string) {
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((CoreBroker *)local_390,pvVar8);
            }
            else {
              generateJsonString((string *)local_390,pvVar8,true);
            }
          }
          else {
            local_390._0_8_ = local_390 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_390,0,0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._0_8_ != paVar18) {
            operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
          }
          if ((_func_int **)local_390._8_8_ == (_func_int **)0x0) {
            local_340._0_8_ = &local_330;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_340,"endpoint","");
            if ((*phVar7 == (helics)0x1) &&
               (iVar9 = CLI::std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                        ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                                 **)(phVar7 + 8),(key_type *)local_340),
               iVar9._M_node != (_Base_ptr)(*(long *)(phVar7 + 8) + 8))) {
              pvVar8 = nlohmann::json_abi_v3_11_3::
                       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                     *)phVar7,(key_type *)local_340);
              if ((pvVar8->m_data).m_type == string) {
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::
                get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          (local_360,pvVar8);
              }
              else {
                generateJsonString((string *)local_360,pvVar8,true);
              }
            }
            else {
              local_360._0_8_ = paVar18;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_360,0,0);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_340._0_8_ != &local_330) {
              operator_delete((void *)local_340._0_8_,
                              CONCAT71(local_330._M_allocated_capacity._1_7_,
                                       local_330._M_local_buf[0]) + 1);
            }
            if (local_360._8_8_ != 0) {
              local_c0._M_allocated_capacity = (size_type)local_b0;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)(local_d0 + 0x10),"targets","");
              callback_02.ept = (string *)in_R8;
              callback_02.brk = (CoreBroker *)local_360;
              addTargets<helics::fileops::makeConnectionsJson<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_4_>
                        (phVar7,(json *)(local_d0 + 0x10),(string *)local_398,callback_02);
              if ((_Hash_node_base *)local_c0._M_allocated_capacity != local_b0) {
                operator_delete((void *)local_c0._M_allocated_capacity,
                                (ulong)((long)&(local_b0[0]._M_nxt)->_M_nxt + 1));
              }
              local_e0._M_allocated_capacity = (size_type)local_d0;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"sources","");
              callback_03.ept = (string *)in_R8;
              callback_03.brk = (CoreBroker *)local_360;
              addTargets<helics::fileops::makeConnectionsJson<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_5_>
                        (phVar7,(json *)&local_e0,(string *)local_398,callback_03);
              if ((pointer)local_e0._M_allocated_capacity != (pointer)local_d0) {
                operator_delete((void *)local_e0._M_allocated_capacity,(ulong)(local_d0._0_8_ + 1));
              }
            }
            uVar14 = local_360._16_8_;
            paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_360._0_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._0_8_ != paVar18) goto LAB_002ff24d;
          }
          else {
            local_80._M_nxt = local_70;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"targets","");
            callback_00.ipt = (string *)in_R8;
            callback_00.brk = (CoreBroker *)local_390;
            addTargets<helics::fileops::makeConnectionsJson<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_2_>
                      (phVar7,(json *)&local_80,(string *)local_398,callback_00);
            if (local_80._M_nxt != local_70) {
              operator_delete(local_80._M_nxt,(ulong)((long)&(local_70[0]._M_nxt)->_M_nxt + 1));
            }
            local_a0[0] = &local_90;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"sources","");
            callback_01.ipt = (string *)in_R8;
            callback_01.brk = (CoreBroker *)local_390;
            addTargets<helics::fileops::makeConnectionsJson<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_3_>
                      (phVar7,(json *)local_a0,(string *)local_398,callback_01);
            uVar14 = local_90._M_allocated_capacity;
            paVar15 = local_a0[0];
            if (local_a0[0] != &local_90) {
LAB_002ff24d:
              operator_delete(paVar15,uVar14 + 1);
            }
          }
          uVar14 = local_390._16_8_;
          p_Var17 = (_Any_data *)local_390._0_8_;
          if ((_Any_data *)local_390._0_8_ != (_Any_data *)(local_390 + 0x10)) goto LAB_002ff269;
        }
        else {
          local_60[0] = &local_50;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"targets","");
          callback.pub = (string *)in_R8;
          callback.brk = (CoreBroker *)local_3b8;
          addTargets<helics::fileops::makeConnectionsJson<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_1_>
                    (phVar7,(json *)local_60,(string *)local_398,callback);
          uVar14 = local_50._M_unused._0_8_;
          p_Var17 = local_60[0];
          if (local_60[0] != &local_50) goto LAB_002ff269;
        }
      }
      if ((undefined1 *)local_3b8._0_8_ != local_3b8 + 0x10) {
        operator_delete((void *)local_3b8._0_8_,local_3b8._16_8_ + 1);
      }
      if (*(char *)local_320._0_8_ == '\x02') {
        aStack_310._M_allocated_capacity = aStack_310._M_allocated_capacity + 0x10;
      }
      else if (*(char *)local_320._0_8_ == '\x01') {
        local_320._8_8_ = std::_Rb_tree_increment((_Rb_tree_node_base *)local_320._8_8_);
      }
      else {
        aStack_310._8_8_ = aStack_310._8_8_ + 1;
      }
    }
  }
  if (local_370._M_local_buf[0] != '\x01') goto LAB_00300336;
  cVar10 = std::
           _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
           ::_M_find_tr<char[6],void>
                     ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                       *)local_370._8_8_,(char (*) [6])"links");
  if (cVar10._M_node != (_Base_ptr)(local_370._8_8_ + 8)) {
    local_320._0_8_ =
         nlohmann::json_abi_v3_11_3::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
         ::operator[]<char_const>
                   ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     *)local_370._M_local_buf,"links");
    local_320._8_8_ = (_Rb_tree_node_base *)0x0;
    aStack_310._M_allocated_capacity = 0;
    aStack_310._8_8_ = (pointer)0x8000000000000000;
    vVar1 = (((reference)local_320._0_8_)->m_data).m_type;
    if (vVar1 == null) {
      aStack_310._8_8_ = (pointer)0x1;
LAB_002ff41b:
      local_2b0._8_8_ = (__pthread_internal_list *)0x0;
      local_2b0._16_8_ = (__pthread_internal_list *)0x0;
      local_298[0].__align = 1;
    }
    else if (vVar1 == array) {
      aStack_310._M_allocated_capacity =
           (size_type)
           (((((reference)local_320._0_8_)->m_data).m_value.array)->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      local_2b0._8_8_ = (__pthread_internal_list *)0x0;
      local_298[0].__align = -0x8000000000000000;
      local_2b0._16_8_ =
           (((((reference)local_320._0_8_)->m_data).m_value.array)->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      if (vVar1 != object) {
        aStack_310._8_8_ = (pointer)0x0;
        goto LAB_002ff41b;
      }
      local_320._8_8_ = ((((reference)local_320._0_8_)->m_data).m_value.binary)->m_subtype;
      local_2b0._16_8_ = (__pthread_internal_list *)0x0;
      local_298[0].__align = -0x8000000000000000;
      local_2b0._8_8_ =
           &(((((reference)local_320._0_8_)->m_data).m_value.object)->_M_t)._M_impl.
            super__Rb_tree_header;
    }
    local_2b0._0_8_ = local_320._0_8_;
    while( true ) {
      paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_360 + 0x10);
      bVar5 = nlohmann::json_abi_v3_11_3::detail::
              iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
              ::
              operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                        ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                          *)local_320,
                         (iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                          *)local_2b0);
      if (bVar5) break;
      phVar7 = (helics *)
               nlohmann::json_abi_v3_11_3::detail::
               iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
               ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                            *)local_320);
      if ((*phVar7 == (helics)0x2) &&
         (0x10 < (ulong)((*(long **)(phVar7 + 8))[1] - **(long **)(phVar7 + 8)))) {
        pvVar8 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)phVar7,0);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (local_3b8,pvVar8);
        uVar16 = local_3b8._8_8_;
        uVar14 = local_3b8._0_8_;
        pvVar8 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)phVar7,1);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((CoreBroker *)local_390,pvVar8);
        source._M_str = (char *)uVar14;
        source._M_len = uVar16;
        target._M_str = (char *)local_390._0_8_;
        target._M_len = local_390._8_8_;
        in_R8 = (_Any_data *)local_390._0_8_;
        CoreBroker::linkEndpoints(local_398,source,target);
        uVar14 = local_390._16_8_;
        p_Var17 = (_Any_data *)local_390._0_8_;
        if ((_Any_data *)local_390._0_8_ != (_Any_data *)(local_390 + 0x10)) {
LAB_002ff9b8:
          operator_delete(p_Var17,uVar14 + 1);
        }
      }
      else {
        local_390._0_8_ = local_390 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"publication","");
        if ((*phVar7 == (helics)0x1) &&
           (iVar9 = CLI::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                    ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                             **)(phVar7 + 8),(key_type *)local_390),
           iVar9._M_node != (_Base_ptr)(*(long *)(phVar7 + 8) + 8))) {
          pvVar8 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                 *)phVar7,(key_type *)local_390);
          if ((pvVar8->m_data).m_type == string) {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (local_3b8,pvVar8);
          }
          else {
            generateJsonString((string *)local_3b8,pvVar8,true);
          }
        }
        else {
          local_3b8._0_8_ = local_3b8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,0,0);
        }
        if ((_Any_data *)local_390._0_8_ != (_Any_data *)(local_390 + 0x10)) {
          operator_delete((void *)local_390._0_8_,local_390._16_8_ + 1);
        }
        if ((_func_int **)local_3b8._8_8_ == (_func_int **)0x0) {
          local_360._0_8_ = paVar18;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"input","");
          local_340._0_8_ = &local_330;
          local_340._8_8_ = 0;
          local_330._M_local_buf[0] = '\0';
          if ((*phVar7 == (helics)0x1) &&
             (iVar9 = CLI::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                      ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                               **)(phVar7 + 8),(key_type *)local_360),
             iVar9._M_node != (_Base_ptr)(*(long *)(phVar7 + 8) + 8))) {
            pvVar8 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                   *)phVar7,(key_type *)local_360);
            if ((pvVar8->m_data).m_type == string) {
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((CoreBroker *)local_390,pvVar8);
            }
            else {
              generateJsonString((string *)local_390,pvVar8,true);
            }
          }
          else {
            local_390._0_8_ = local_390 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_390,&local_330);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_340._0_8_ != &local_330) {
            operator_delete((void *)local_340._0_8_,
                            CONCAT71(local_330._M_allocated_capacity._1_7_,local_330._M_local_buf[0]
                                    ) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._0_8_ != paVar18) {
            operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
          }
          if ((_func_int **)local_390._8_8_ == (_func_int **)0x0) {
            local_340._0_8_ = &local_330;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_340,"endpoint","");
            local_240._0_8_ = local_240 + 0x10;
            local_240._8_8_ = (pointer)0x0;
            local_240[0x10] = '\0';
            if ((*phVar7 == (helics)0x1) &&
               (iVar9 = CLI::std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                        ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                                 **)(phVar7 + 8),(key_type *)local_340),
               iVar9._M_node != (_Base_ptr)(*(long *)(phVar7 + 8) + 8))) {
              pvVar8 = nlohmann::json_abi_v3_11_3::
                       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                     *)phVar7,(key_type *)local_340);
              if ((pvVar8->m_data).m_type == string) {
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::
                get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          (local_360,pvVar8);
              }
              else {
                generateJsonString((string *)local_360,pvVar8,true);
              }
            }
            else {
              local_360._0_8_ = paVar18;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_360,local_240 + 0x10);
            }
            if ((pointer)local_240._0_8_ != (pointer)(local_240 + 0x10)) {
              operator_delete((void *)local_240._0_8_,CONCAT71(local_240._17_7_,local_240[0x10]) + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_340._0_8_ != &local_330) {
              operator_delete((void *)local_340._0_8_,
                              CONCAT71(local_330._M_allocated_capacity._1_7_,
                                       local_330._M_local_buf[0]) + 1);
            }
            if (local_360._8_8_ != 0) {
              local_160._M_allocated_capacity = (size_type)&local_150;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"targets","");
              callback_07.ept = (string *)in_R8;
              callback_07.brk = (CoreBroker *)local_360;
              addTargets<helics::fileops::makeConnectionsJson<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_9_>
                        (phVar7,(json *)&local_160,(string *)local_398,callback_07);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_allocated_capacity != &local_150) {
                operator_delete((void *)local_160._M_allocated_capacity,
                                local_150._M_allocated_capacity + 1);
              }
              local_180._M_p = (pointer)&local_170;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"sources","");
              callback_08.ept = (string *)in_R8;
              callback_08.brk = (CoreBroker *)local_360;
              addTargets<helics::fileops::makeConnectionsJson<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_10_>
                        (phVar7,(json *)&local_180,(string *)local_398,callback_08);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_180._M_p != &local_170) {
                operator_delete(local_180._M_p,local_170._M_allocated_capacity + 1);
              }
            }
            uVar14 = local_360._16_8_;
            uVar16 = local_360._0_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._0_8_ != paVar18) goto LAB_002ff99c;
          }
          else {
            local_120._0_8_ = local_110;
            std::__cxx11::string::_M_construct<char_const*>(local_120,"targets","");
            callback_05.ipt = (string *)in_R8;
            callback_05.brk = (CoreBroker *)local_390;
            addTargets<helics::fileops::makeConnectionsJson<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_7_>
                      (phVar7,(json *)local_120,(string *)local_398,callback_05);
            if ((undefined8 *)local_120._0_8_ != local_110) {
              operator_delete((void *)local_120._0_8_,(ulong)(local_110[0] + 1));
            }
            local_140._M_allocated_capacity = (size_type)&local_130;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"sources","");
            callback_06.ipt = (string *)in_R8;
            callback_06.brk = (CoreBroker *)local_390;
            addTargets<helics::fileops::makeConnectionsJson<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_8_>
                      (phVar7,(json *)&local_140,(string *)local_398,callback_06);
            uVar14 = local_130._M_allocated_capacity;
            uVar16 = local_140._0_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_140._0_8_ != &local_130) {
LAB_002ff99c:
              operator_delete((void *)uVar16,
                              (ulong)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar14
                                             )->_vptr__Sp_counted_base + 1));
            }
          }
          uVar14 = local_390._16_8_;
          p_Var17 = (_Any_data *)local_390._0_8_;
          if ((_Any_data *)local_390._0_8_ != (_Any_data *)(local_390 + 0x10)) goto LAB_002ff9b8;
        }
        else {
          local_100[0] = &local_f0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"targets","");
          callback_04.pub = (string *)in_R8;
          callback_04.brk = (CoreBroker *)local_3b8;
          addTargets<helics::fileops::makeConnectionsJson<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_6_>
                    (phVar7,(json *)local_100,(string *)local_398,callback_04);
          uVar14 = local_f0._M_unused._0_8_;
          p_Var17 = local_100[0];
          if (local_100[0] != &local_f0) goto LAB_002ff9b8;
        }
      }
      if ((undefined1 *)local_3b8._0_8_ != local_3b8 + 0x10) {
        operator_delete((void *)local_3b8._0_8_,local_3b8._16_8_ + 1);
      }
      if (*(char *)local_320._0_8_ == '\x02') {
        aStack_310._M_allocated_capacity = aStack_310._M_allocated_capacity + 0x10;
      }
      else if (*(char *)local_320._0_8_ == '\x01') {
        local_320._8_8_ = std::_Rb_tree_increment((_Rb_tree_node_base *)local_320._8_8_);
      }
      else {
        aStack_310._8_8_ = aStack_310._8_8_ + 1;
      }
    }
  }
  if (local_370._M_local_buf[0] != '\x01') goto LAB_00300336;
  cVar10 = std::
           _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
           ::_M_find_tr<char[8],void>
                     ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                       *)local_370._8_8_,(char (*) [8])0x3efcee);
  if (cVar10._M_node != (_Base_ptr)(local_370._8_8_ + 8)) {
    local_320._0_8_ =
         nlohmann::json_abi_v3_11_3::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
         ::operator[]<char_const>
                   ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     *)local_370._M_local_buf,"filters");
    local_320._8_8_ = (_Rb_tree_node_base *)0x0;
    aStack_310._M_allocated_capacity = 0;
    aStack_310._8_8_ = (pointer)0x8000000000000000;
    vVar1 = (((reference)local_320._0_8_)->m_data).m_type;
    if (vVar1 == null) {
      aStack_310._8_8_ = (pointer)0x1;
LAB_002ffb6a:
      local_2b0._8_8_ = (__pthread_internal_list *)0x0;
      local_2b0._16_8_ = (__pthread_internal_list *)0x0;
      local_298[0].__align = 1;
    }
    else if (vVar1 == array) {
      aStack_310._M_allocated_capacity =
           (size_type)
           (((((reference)local_320._0_8_)->m_data).m_value.array)->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      local_2b0._8_8_ = (__pthread_internal_list *)0x0;
      local_298[0].__align = -0x8000000000000000;
      local_2b0._16_8_ =
           (((((reference)local_320._0_8_)->m_data).m_value.array)->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      if (vVar1 != object) {
        aStack_310._8_8_ = (pointer)0x0;
        goto LAB_002ffb6a;
      }
      local_320._8_8_ = ((((reference)local_320._0_8_)->m_data).m_value.binary)->m_subtype;
      local_2b0._16_8_ = (__pthread_internal_list *)0x0;
      local_298[0].__align = -0x8000000000000000;
      local_2b0._8_8_ =
           &(((((reference)local_320._0_8_)->m_data).m_value.object)->_M_t)._M_impl.
            super__Rb_tree_header;
    }
    local_2b0._0_8_ = local_320._0_8_;
    while( true ) {
      bVar5 = nlohmann::json_abi_v3_11_3::detail::
              iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
              ::
              operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                        ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                          *)local_320,
                         (iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                          *)local_2b0);
      if (bVar5) break;
      phVar7 = (helics *)
               nlohmann::json_abi_v3_11_3::detail::
               iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
               ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                            *)local_320);
      if (*phVar7 == (helics)0x2) {
        pvVar8 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)phVar7,0);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (local_3b8,pvVar8);
        uVar16 = local_3b8._8_8_;
        uVar14 = local_3b8._0_8_;
        pvVar8 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)phVar7,1);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (local_390,pvVar8);
        filter._M_str = (char *)uVar14;
        filter._M_len = uVar16;
        endpoint._M_str = (char *)local_390._0_8_;
        endpoint._M_len = local_390._8_8_;
        in_R8 = (_Any_data *)local_390._0_8_;
        CoreBroker::addSourceFilterToEndpoint(local_398,filter,endpoint);
        uVar14 = local_390._16_8_;
        p_Var17 = (_Any_data *)local_390._0_8_;
        if ((_Any_data *)local_390._0_8_ != (_Any_data *)(local_390 + 0x10)) {
LAB_002ffecf:
          operator_delete(p_Var17,(ulong)((long)&((pointer)uVar14)->messageAction + 1));
        }
      }
      else {
        local_390._0_8_ = local_390 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"filter","");
        if ((*phVar7 == (helics)0x1) &&
           (iVar9 = CLI::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                    ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                             **)(phVar7 + 8),(key_type *)local_390),
           iVar9._M_node != (_Base_ptr)(*(long *)(phVar7 + 8) + 8))) {
          pvVar8 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                 *)phVar7,(key_type *)local_390);
          if ((pvVar8->m_data).m_type == string) {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (local_3b8,pvVar8);
          }
          else {
            generateJsonString((string *)local_3b8,pvVar8,true);
          }
        }
        else {
          local_3b8._0_8_ = local_3b8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,0,0);
        }
        if ((_Any_data *)local_390._0_8_ != (_Any_data *)(local_390 + 0x10)) {
          operator_delete((void *)local_390._0_8_,local_390._16_8_ + 1);
        }
        if ((_func_int **)local_3b8._8_8_ != (_func_int **)0x0) {
          local_1a0.internalTimeCode = (baseType)&local_190;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"endpoints","");
          callback_09.fname = (string *)in_R8;
          callback_09.brk = (CoreBroker *)local_3b8;
          addTargets<helics::fileops::makeConnectionsJson<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_11_>
                    (phVar7,(json *)&local_1a0,(string *)local_398,callback_09);
          if ((_Elt_pointer)local_1a0.internalTimeCode != (_Elt_pointer)&local_190) {
            operator_delete((void *)local_1a0.internalTimeCode,(long)local_190.__d.__r + 1);
          }
          local_1c0.internalTimeCode = (baseType)&local_1b0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1c0,"source_endpoints","");
          callback_10.fname = (string *)in_R8;
          callback_10.brk = (CoreBroker *)local_3b8;
          addTargets<helics::fileops::makeConnectionsJson<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_11_>
                    (phVar7,(json *)&local_1c0,(string *)local_398,callback_10);
          if ((_Elt_pointer)local_1c0.internalTimeCode != (_Elt_pointer)&local_1b0) {
            operator_delete((void *)local_1c0.internalTimeCode,
                            (ulong)((long)&(local_1b0._M_pi)->_vptr__Sp_counted_base + 1));
          }
          local_1e0[0] = (_Elt_pointer)&local_1d0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"sourceEndpoints","");
          callback_11.fname = (string *)in_R8;
          callback_11.brk = (CoreBroker *)local_3b8;
          addTargets<helics::fileops::makeConnectionsJson<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_11_>
                    (phVar7,(json *)local_1e0,(string *)local_398,callback_11);
          if (local_1e0[0] != (_Elt_pointer)&local_1d0) {
            operator_delete(local_1e0[0],(ulong)(local_1d0.internalTimeCode + 1));
          }
          local_200[0] = (_Elt_pointer)local_1f0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"dest_endpoints","");
          callback_12.fname = (string *)in_R8;
          callback_12.brk = (CoreBroker *)local_3b8;
          addTargets<helics::fileops::makeConnectionsJson<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_12_>
                    (phVar7,(json *)local_200,(string *)local_398,callback_12);
          if (local_200[0] != (_Elt_pointer)local_1f0) {
            operator_delete(local_200[0],(ulong)((long)&local_1f0[0]->messageAction + 1));
          }
          local_220._0_8_ = &local_210;
          std::__cxx11::string::_M_construct<char_const*>(local_220,"destEndpoints","");
          callback_13.fname = (string *)in_R8;
          callback_13.brk = (CoreBroker *)local_3b8;
          addTargets<helics::fileops::makeConnectionsJson<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_12_>
                    (phVar7,(json *)local_220,(string *)local_398,callback_13);
          uVar14 = local_210._M_unused._0_8_;
          p_Var17 = (_Any_data *)local_220._0_8_;
          if ((_Any_data *)local_220._0_8_ != &local_210) goto LAB_002ffecf;
        }
      }
      if ((undefined1 *)local_3b8._0_8_ != local_3b8 + 0x10) {
        operator_delete((void *)local_3b8._0_8_,local_3b8._16_8_ + 1);
      }
      if (*(char *)local_320._0_8_ == '\x02') {
        aStack_310._M_allocated_capacity = aStack_310._M_allocated_capacity + 0x10;
      }
      else if (*(char *)local_320._0_8_ == '\x01') {
        local_320._8_8_ = std::_Rb_tree_increment((_Rb_tree_node_base *)local_320._8_8_);
      }
      else {
        aStack_310._8_8_ = aStack_310._8_8_ + 1;
      }
    }
  }
  if (local_370._M_local_buf[0] != '\x01') goto LAB_00300336;
  cVar10 = std::
           _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
           ::_M_find_tr<char[8],void>
                     ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                       *)local_370._8_8_,(char (*) [8])"globals");
  if (cVar10._M_node != (_Base_ptr)(local_370._8_8_ + 8)) {
    pvVar11 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          *)local_370._M_local_buf,"globals");
    if ((pvVar11->m_data).m_type == array) {
      local_320._0_8_ =
           nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)local_370._M_local_buf,"globals");
      local_320._8_8_ = (_Rb_tree_node_base *)0x0;
      aStack_310._M_allocated_capacity = 0;
      aStack_310._8_8_ = (pointer)0x8000000000000000;
      vVar1 = (((reference)local_320._0_8_)->m_data).m_type;
      if (vVar1 == null) {
        aStack_310._8_8_ = (pointer)0x1;
LAB_003003af:
        local_2b0._8_8_ = (__pthread_internal_list *)0x0;
        local_2b0._16_8_ = (__pthread_internal_list *)0x0;
        local_298[0].__align = 1;
      }
      else if (vVar1 == array) {
        aStack_310._M_allocated_capacity =
             (size_type)
             (((((reference)local_320._0_8_)->m_data).m_value.array)->
             super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
        local_2b0._8_8_ = (__pthread_internal_list *)0x0;
        local_298[0].__align = -0x8000000000000000;
        local_2b0._16_8_ =
             (((((reference)local_320._0_8_)->m_data).m_value.array)->
             super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        if (vVar1 != object) {
          aStack_310._8_8_ = (pointer)0x0;
          goto LAB_003003af;
        }
        local_320._8_8_ = ((((reference)local_320._0_8_)->m_data).m_value.binary)->m_subtype;
        local_2b0._16_8_ = (__pthread_internal_list *)0x0;
        local_298[0].__align = -0x8000000000000000;
        local_2b0._8_8_ =
             &(((((reference)local_320._0_8_)->m_data).m_value.object)->_M_t)._M_impl.
              super__Rb_tree_header;
      }
      local_2b0._0_8_ = local_320._0_8_;
      while (bVar5 = nlohmann::json_abi_v3_11_3::detail::
                     iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                     ::
                     operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                               ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                 *)local_320,
                                (iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                 *)local_2b0), !bVar5) {
        pbVar13 = nlohmann::json_abi_v3_11_3::detail::
                  iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                  ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)local_320);
        pvVar8 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 ::operator[](pbVar13,0);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (local_3b8,pvVar8);
        uVar16 = local_3b8._8_8_;
        uVar14 = local_3b8._0_8_;
        pvVar8 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 ::operator[](pbVar13,1);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (local_390,pvVar8);
        valueName_00._M_str = (char *)uVar14;
        valueName_00._M_len = uVar16;
        value_00._M_str = (char *)local_390._0_8_;
        value_00._M_len = local_390._8_8_;
        CoreBroker::setGlobal(local_398,valueName_00,value_00);
        if ((_Any_data *)local_390._0_8_ != (_Any_data *)(local_390 + 0x10)) {
          operator_delete((void *)local_390._0_8_,local_390._16_8_ + 1);
        }
        if ((undefined1 *)local_3b8._0_8_ != local_3b8 + 0x10) {
          operator_delete((void *)local_3b8._0_8_,local_3b8._16_8_ + 1);
        }
        if (*(char *)local_320._0_8_ == '\x02') {
          aStack_310._M_allocated_capacity = aStack_310._M_allocated_capacity + 0x10;
        }
        else if (*(char *)local_320._0_8_ == '\x01') {
          local_320._8_8_ = std::_Rb_tree_increment((_Rb_tree_node_base *)local_320._8_8_);
        }
        else {
          aStack_310._8_8_ = aStack_310._8_8_ + 1;
        }
      }
    }
    else {
      local_390._0_8_ =
           nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)local_370._M_local_buf,"globals");
      nlohmann::json_abi_v3_11_3::detail::
      iteration_proxy<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
      ::begin((iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
               *)local_320,
              (iteration_proxy<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
               *)local_390);
      nlohmann::json_abi_v3_11_3::detail::
      iteration_proxy<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
      ::end((iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
             *)local_2b0,
            (iteration_proxy<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
             *)local_390);
      while (bVar5 = nlohmann::json_abi_v3_11_3::detail::
                     iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                     ::
                     operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                               ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                 *)local_320,
                                (iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                 *)local_2b0), !bVar5) {
        psVar12 = nlohmann::json_abi_v3_11_3::detail::
                  iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                  ::key((iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                         *)local_320);
        pcVar2 = (psVar12->_M_dataplus)._M_p;
        sVar3 = psVar12->_M_string_length;
        pbVar13 = nlohmann::json_abi_v3_11_3::detail::
                  iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                  ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)local_320);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (local_3b8,pbVar13);
        valueName._M_str = pcVar2;
        valueName._M_len = sVar3;
        value._M_str = (char *)local_3b8._0_8_;
        value._M_len = local_3b8._8_8_;
        CoreBroker::setGlobal(local_398,valueName,value);
        if ((undefined1 *)local_3b8._0_8_ != local_3b8 + 0x10) {
          operator_delete((void *)local_3b8._0_8_,local_3b8._16_8_ + 1);
        }
        if (*(char *)local_320._0_8_ == '\x02') {
          aStack_310._M_allocated_capacity = aStack_310._M_allocated_capacity + 0x10;
        }
        else if (*(char *)local_320._0_8_ == '\x01') {
          local_320._8_8_ = std::_Rb_tree_increment((_Rb_tree_node_base *)local_320._8_8_);
        }
        else {
          aStack_310._8_8_ = aStack_310._8_8_ + 1;
        }
        local_300._M_p = local_300._M_p + 1;
      }
      nlohmann::json_abi_v3_11_3::detail::
      iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
      ::~iteration_proxy_value
                ((iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                  *)local_2b0);
      nlohmann::json_abi_v3_11_3::detail::
      iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
      ::~iteration_proxy_value
                ((iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                  *)local_320);
    }
  }
  if ((local_370._M_local_buf[0] != '\x01') ||
     (cVar10 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
               ::_M_find_tr<char[8],void>
                         ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                           *)local_370._8_8_,(char (*) [8])"aliases"),
     cVar10._M_node == (_Base_ptr)(local_370._8_8_ + 8))) goto LAB_00300336;
  pvVar11 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        *)local_370._M_local_buf,"aliases");
  if ((pvVar11->m_data).m_type != array) {
    local_390._0_8_ =
         nlohmann::json_abi_v3_11_3::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
         ::operator[]<char_const>
                   ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     *)local_370._M_local_buf,"aliases");
    nlohmann::json_abi_v3_11_3::detail::
    iteration_proxy<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
    ::begin((iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
             *)local_320,
            (iteration_proxy<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
             *)local_390);
    nlohmann::json_abi_v3_11_3::detail::
    iteration_proxy<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
    ::end((iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           *)local_2b0,
          (iteration_proxy<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           *)local_390);
    while (bVar5 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::
                   operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                             ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)local_320,
                              (iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)local_2b0), !bVar5) {
      psVar12 = nlohmann::json_abi_v3_11_3::detail::
                iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                ::key((iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                       *)local_320);
      pcVar2 = (psVar12->_M_dataplus)._M_p;
      sVar3 = psVar12->_M_string_length;
      pbVar13 = nlohmann::json_abi_v3_11_3::detail::
                iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                             *)local_320);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (local_3b8,pbVar13);
      interfaceKey._M_str = pcVar2;
      interfaceKey._M_len = sVar3;
      alias._M_str = (char *)local_3b8._0_8_;
      alias._M_len = local_3b8._8_8_;
      CoreBroker::addAlias(local_398,interfaceKey,alias);
      if ((undefined1 *)local_3b8._0_8_ != local_3b8 + 0x10) {
        operator_delete((void *)local_3b8._0_8_,local_3b8._16_8_ + 1);
      }
      if (*(char *)local_320._0_8_ == '\x02') {
        aStack_310._M_allocated_capacity = aStack_310._M_allocated_capacity + 0x10;
      }
      else if (*(char *)local_320._0_8_ == '\x01') {
        local_320._8_8_ = std::_Rb_tree_increment((_Rb_tree_node_base *)local_320._8_8_);
      }
      else {
        aStack_310._8_8_ = aStack_310._8_8_ + 1;
      }
      local_300._M_p = local_300._M_p + 1;
    }
    nlohmann::json_abi_v3_11_3::detail::
    iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
    ::~iteration_proxy_value
              ((iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                *)local_2b0);
    nlohmann::json_abi_v3_11_3::detail::
    iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
    ::~iteration_proxy_value
              ((iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                *)local_320);
    goto LAB_00300336;
  }
  local_320._0_8_ =
       nlohmann::json_abi_v3_11_3::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
       ::operator[]<char_const>
                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   *)local_370._M_local_buf,"aliases");
  local_320._8_8_ = (_Rb_tree_node_base *)0x0;
  aStack_310._M_allocated_capacity = 0;
  aStack_310._8_8_ = (pointer)0x8000000000000000;
  vVar1 = (((reference)local_320._0_8_)->m_data).m_type;
  if (vVar1 == null) {
    aStack_310._8_8_ = (pointer)0x1;
LAB_00300530:
    local_2b0._8_8_ = (__pthread_internal_list *)0x0;
    local_2b0._16_8_ = (__pthread_internal_list *)0x0;
    local_298[0].__align = 1;
  }
  else if (vVar1 == array) {
    aStack_310._M_allocated_capacity =
         (size_type)
         (((((reference)local_320._0_8_)->m_data).m_value.array)->
         super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    local_2b0._8_8_ = (__pthread_internal_list *)0x0;
    local_298[0].__align = -0x8000000000000000;
    local_2b0._16_8_ =
         (((((reference)local_320._0_8_)->m_data).m_value.array)->
         super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    if (vVar1 != object) {
      aStack_310._8_8_ = (pointer)0x0;
      goto LAB_00300530;
    }
    local_320._8_8_ = ((((reference)local_320._0_8_)->m_data).m_value.binary)->m_subtype;
    local_2b0._16_8_ = (__pthread_internal_list *)0x0;
    local_298[0].__align = -0x8000000000000000;
    local_2b0._8_8_ =
         &(((((reference)local_320._0_8_)->m_data).m_value.object)->_M_t)._M_impl.
          super__Rb_tree_header;
  }
  local_2b0._0_8_ = local_320._0_8_;
  while (bVar5 = nlohmann::json_abi_v3_11_3::detail::
                 iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                 ::
                 operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                           ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                             *)local_320,
                            (iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                             *)local_2b0), !bVar5) {
    pbVar13 = nlohmann::json_abi_v3_11_3::detail::
              iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
              ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                           *)local_320);
    pvVar8 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             ::operator[](pbVar13,0);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (local_3b8,pvVar8);
    uVar16 = local_3b8._8_8_;
    uVar14 = local_3b8._0_8_;
    pvVar8 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             ::operator[](pbVar13,1);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (local_390,pvVar8);
    interfaceKey_00._M_str = (char *)uVar14;
    interfaceKey_00._M_len = uVar16;
    alias_00._M_str = (char *)local_390._0_8_;
    alias_00._M_len = local_390._8_8_;
    CoreBroker::addAlias(local_398,interfaceKey_00,alias_00);
    if ((_Any_data *)local_390._0_8_ != (_Any_data *)(local_390 + 0x10)) {
      operator_delete((void *)local_390._0_8_,local_390._16_8_ + 1);
    }
    if ((undefined1 *)local_3b8._0_8_ != local_3b8 + 0x10) {
      operator_delete((void *)local_3b8._0_8_,local_3b8._16_8_ + 1);
    }
    if (*(char *)local_320._0_8_ == '\x02') {
      aStack_310._M_allocated_capacity = aStack_310._M_allocated_capacity + 0x10;
    }
    else if (*(char *)local_320._0_8_ == '\x01') {
      local_320._8_8_ = std::_Rb_tree_increment((_Rb_tree_node_base *)local_320._8_8_);
    }
    else {
      aStack_310._8_8_ = aStack_310._8_8_ + 1;
    }
  }
LAB_00300336:
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data((data *)&local_370);
  return;
}

Assistant:

void makeConnectionsJson(brkX* brk, const std::string& file)
{
    static_assert(std::is_base_of<Broker, brkX>::value || std::is_base_of<Core, brkX>::value,
                  "input must be Core or Broker");
    nlohmann::json doc;
    try {
        doc = loadJson(file);
    }
    catch (const std::invalid_argument& ia) {
        throw(helics::InvalidParameter(ia.what()));
    }

    if (doc.contains("connections")) {
        for (const auto& conn : doc["connections"]) {
            if (conn.is_array() && conn.size() >= 2) {
                brk->dataLink(conn[0].get<std::string>(), conn[1].get<std::string>());
            } else {
                std::string pub = fileops::getOrDefault(conn, "publication", std::string_view());
                if (!pub.empty()) {
                    addTargets(conn, "targets", [brk, &pub](std::string_view target) {
                        brk->dataLink(pub, target);
                    });
                } else {
                    std::string ipt = fileops::getOrDefault(conn, "input", std::string_view());
                    if (!ipt.empty()) {
                        addTargets(conn, "targets", [brk, &ipt](std::string_view target) {
                            brk->dataLink(target, ipt);
                        });
                        addTargets(conn, "sources", [brk, &ipt](std::string_view source) {
                            brk->dataLink(source, ipt);
                        });
                    } else {
                        std::string ept =
                            fileops::getOrDefault(conn, "endpoint", std::string_view());
                        if (!ept.empty()) {
                            addTargets(conn, "targets", [brk, &ept](std::string_view target) {
                                brk->linkEndpoints(ept, target);
                            });
                            addTargets(conn, "sources", [brk, &ept](std::string_view source) {
                                brk->linkEndpoints(source, ept);
                            });
                        }
                    }
                }
            }
        }
    }
    if (doc.contains("links")) {
        for (const auto& conn : doc["links"]) {
            if (conn.is_array() && conn.size() >= 2) {
                brk->linkEndpoints(conn[0].get<std::string>(), conn[1].get<std::string>());
            } else {
                std::string pub = fileops::getOrDefault(conn, "publication", std::string_view());
                if (!pub.empty()) {
                    addTargets(conn, "targets", [brk, &pub](std::string_view target) {
                        brk->dataLink(pub, target);
                    });
                } else {
                    std::string ipt = fileops::getOrDefault(conn, "input", std::string());
                    if (!ipt.empty()) {
                        addTargets(conn, "targets", [brk, &ipt](std::string_view target) {
                            brk->dataLink(target, ipt);
                        });
                        addTargets(conn, "sources", [brk, &ipt](std::string_view source) {
                            brk->dataLink(source, ipt);
                        });
                    } else {
                        std::string ept = fileops::getOrDefault(conn, "endpoint", std::string());
                        if (!ept.empty()) {
                            addTargets(conn, "targets", [brk, &ept](std::string_view target) {
                                brk->linkEndpoints(ept, target);
                            });
                            addTargets(conn, "sources", [brk, &ept](std::string_view source) {
                                brk->linkEndpoints(source, ept);
                            });
                        }
                    }
                }
            }
        }
    }
    if (doc.contains("filters")) {
        for (const auto& filt : doc["filters"]) {
            if (filt.is_array()) {
                brk->addSourceFilterToEndpoint(filt[0].get<std::string>(),
                                               filt[1].get<std::string>());
            } else {
                std::string fname = fileops::getOrDefault(filt, "filter", std::string_view());
                if (!fname.empty()) {
                    auto asrc = [brk, &fname](std::string_view ept) {
                        brk->addSourceFilterToEndpoint(fname, ept);
                    };
                    addTargets(filt, "endpoints", asrc);
                    addTargets(filt, "source_endpoints", asrc);
                    addTargets(filt, "sourceEndpoints", asrc);
                    auto adst = [brk, &fname](std::string_view ept) {
                        brk->addDestinationFilterToEndpoint(fname, ept);
                    };
                    addTargets(filt, "dest_endpoints", adst);
                    addTargets(filt, "destEndpoints", adst);
                }
            }
        }
    }
    if (doc.contains("globals")) {
        if (doc["globals"].is_array()) {
            for (const auto& val : doc["globals"]) {
                brk->setGlobal(val[0].get<std::string>(), val[1].get<std::string>());
            }
        } else {
            for (const auto& member : doc["globals"].items()) {
                brk->setGlobal(member.key(), member.value().get<std::string>());
            }
        }
    }

    if (doc.contains("aliases")) {
        if (doc["aliases"].is_array()) {
            for (const auto& val : doc["aliases"]) {
                brk->addAlias(val[0].get<std::string>(), val[1].get<std::string>());
            }
        } else {
            for (const auto& member : doc["aliases"].items()) {
                brk->addAlias(member.key(), member.value().get<std::string>());
            }
        }
    }

    if constexpr (std::is_base_of<Core, brkX>::value) {
        loadTags(doc, [brk](std::string_view tagname, std::string_view tagvalue) {
            brk->setFederateTag(gLocalCoreId, tagname, tagvalue);
        });
    }
}